

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemTable.cpp
# Opt level: O1

void __thiscall ItemTable::BlueRoomOne(ItemTable *this)

{
  ItemWrapper *this_00;
  ItemWrapper *this_01;
  mapped_type *ppIVar1;
  key_type local_b4;
  string local_b0;
  string local_90;
  Item local_70;
  Item local_48;
  
  this_00 = (ItemWrapper *)operator_new(0x58);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"A Torch","");
  Item::Item(&local_48,&local_90,TORCH);
  ItemWrapper::ItemWrapper(this_00,&local_48,HIDDEN);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.name._M_dataplus._M_p != &local_48.name.field_2) {
    operator_delete(local_48.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  this_01 = (ItemWrapper *)operator_new(0x58);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Stairs","");
  Item::Item(&local_70,&local_b0,STAIRS);
  ItemWrapper::ItemWrapper(this_01,&local_70,HIDDEN);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.name._M_dataplus._M_p != &local_70.name.field_2) {
    operator_delete(local_70.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  local_b4 = TORCH;
  ppIVar1 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,&local_b4);
  *ppIVar1 = this_00;
  local_b4 = STAIRS;
  ppIVar1 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,&local_b4);
  *ppIVar1 = this_01;
  return;
}

Assistant:

void ItemTable::BlueRoomOne() {
    ItemWrapper * Torch = new ItemWrapper(Item("A Torch", TORCH), HIDDEN);
    ItemWrapper * Stairs = new ItemWrapper(Item("Stairs", STAIRS), HIDDEN);
    items[TORCH] = Torch;
    items[STAIRS] = Stairs;
}